

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore.cc
# Opt level: O0

void CB_EXPLORE::predict_or_learn_first<false>(cb_explore *data,single_learner *base,example *ec)

{
  action_score *paVar1;
  long in_RDX;
  long in_RDI;
  uint32_t i_1;
  uint32_t chosen;
  uint32_t i;
  float prob;
  action_scores probs;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  uint uVar2;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  uint uVar3;
  undefined4 in_stack_ffffffffffffffc4;
  v_array<ACTION_SCORE::action_score> local_38;
  long local_18;
  long local_8;
  
  local_38._begin = *(action_score **)(in_RDX + 0x6850);
  local_38._end = *(action_score **)(in_RDX + 0x6858);
  local_38.end_array = *(action_score **)(in_RDX + 0x6860);
  local_38.erase_count = *(size_t *)(in_RDX + 0x6868);
  local_18 = in_RDX;
  local_8 = in_RDI;
  LEARNER::learner<char,_example>::predict
            ((learner<char,_example> *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)
             ,(example *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  v_array<ACTION_SCORE::action_score>::clear
            ((v_array<ACTION_SCORE::action_score> *)
             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  if (*(long *)(local_8 + 0x108) == 0) {
    uVar3 = *(int *)(local_18 + 0x6850) - 1;
    for (uVar2 = 0; uVar2 < *(uint *)(local_8 + 0x10); uVar2 = uVar2 + 1) {
      v_array<ACTION_SCORE::action_score>::push_back
                ((v_array<ACTION_SCORE::action_score> *)CONCAT44(uVar3,uVar2),
                 (action_score *)(ulong)uVar2);
    }
    paVar1 = v_array<ACTION_SCORE::action_score>::operator[](&local_38,(ulong)uVar3);
    paVar1->score = 1.0;
  }
  else {
    for (uVar3 = 0; uVar3 < *(uint *)(local_8 + 0x10); uVar3 = uVar3 + 1) {
      v_array<ACTION_SCORE::action_score>::push_back
                ((v_array<ACTION_SCORE::action_score> *)
                 CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 (action_score *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    }
    *(long *)(local_8 + 0x108) = *(long *)(local_8 + 0x108) + -1;
  }
  *(action_score **)(local_18 + 0x6850) = local_38._begin;
  *(action_score **)(local_18 + 0x6858) = local_38._end;
  *(action_score **)(local_18 + 0x6860) = local_38.end_array;
  *(size_t *)(local_18 + 0x6868) = local_38.erase_count;
  return;
}

Assistant:

void predict_or_learn_first(cb_explore& data, single_learner& base, example& ec)
{
  // Explore tau times, then act according to optimal.
  action_scores probs = ec.pred.a_s;

  if (is_learn && ec.l.cb.costs[0].probability < 1)
    base.learn(ec);
  else
    base.predict(ec);

  probs.clear();
  if (data.tau > 0)
  {
    float prob = 1.f / (float)data.cbcs.num_actions;
    for (uint32_t i = 0; i < data.cbcs.num_actions; i++) probs.push_back({i, prob});
    data.tau--;
  }
  else
  {
    uint32_t chosen = ec.pred.multiclass - 1;
    for (uint32_t i = 0; i < data.cbcs.num_actions; i++) probs.push_back({i, 0.});
    probs[chosen].score = 1.0;
  }

  ec.pred.a_s = probs;
}